

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall
TTD::SnapShot::EmitSnapshotToFile(SnapShot *this,FileWriter *writer,ThreadContext *threadContext)

{
  bool bVar1;
  uint32 uVar2;
  SnapContext *snapCtx;
  uint *puVar3;
  FunctionBodyResolveInfo *fbInfo;
  SnapObject *snpObject;
  double dVar4;
  double almostEndWrite;
  Iterator iter_3;
  undefined1 local_f0 [7];
  bool firstObj;
  Iterator iter_2;
  undefined1 local_c0 [7];
  bool firstBody;
  Iterator iter_1;
  undefined1 local_90 [7];
  bool firstTCSymbol;
  Iterator iter;
  uint64 uStack_60;
  bool firstCtx;
  uint64 reservedSpace;
  uint64 usedSpace;
  double local_40;
  double startWrite;
  TTDTimer timer;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  SnapShot *this_local;
  
  timer.m_timer.data.previousDifference = (ULONGLONG)threadContext;
  TTDTimer::TTDTimer((TTDTimer *)&startWrite);
  local_40 = TTDTimer::Now((TTDTimer *)&startWrite);
  (*writer->_vptr_FileWriter[6])(writer,0);
  (*writer->_vptr_FileWriter[8])(writer,1);
  reservedSpace = 0;
  uStack_60 = 0;
  ComputeSnapshotMemory(this,&reservedSpace,&stack0xffffffffffffffa0);
  FileWriter::WriteDouble
            (writer,timeTotal,this->GCTime + this->MarkTime + this->ExtractTime,NoSeparator);
  FileWriter::WriteUInt64(writer,usedMemory,reservedSpace,CommaSeparator);
  FileWriter::WriteUInt64(writer,reservedMemory,uStack_60,CommaSeparator);
  FileWriter::WriteDouble(writer,timeGC,this->GCTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeMark,this->MarkTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeExtract,this->ExtractTime,CommaSeparator);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&this->m_ctxList);
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  iter.m_currEntry._7_1_ = CommaSeparator;
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
            ((Iterator *)local_90,&this->m_ctxList);
  while( true ) {
    bVar1 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                      ((Iterator *)local_90);
    if (!bVar1) break;
    snapCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                        ((Iterator *)local_90);
    NSSnapValues::EmitSnapContext
              (snapCtx,writer,iter.m_currEntry._7_1_ & CommaSeparator ^ CommaAndBigSpaceSeparator);
    iter.m_currEntry._7_1_ = NoSeparator;
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext
              ((Iterator *)local_90);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  uVar2 = UnorderedArrayList<int,_32UL>::Count(&this->m_tcSymbolRegistrationMapContents);
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  iter_1.m_currEntry._7_1_ = 1;
  UnorderedArrayList<int,_32UL>::GetIterator
            ((Iterator *)local_c0,&this->m_tcSymbolRegistrationMapContents);
  while( true ) {
    bVar1 = UnorderedArrayList<int,_32UL>::Iterator::IsValid((Iterator *)local_c0);
    if (!bVar1) break;
    puVar3 = (uint *)UnorderedArrayList<int,_32UL>::Iterator::Current((Iterator *)local_c0);
    (*writer->_vptr_FileWriter[0xe])
              (writer,(ulong)*puVar3,(ulong)((byte)~iter_1.m_currEntry._7_1_ & 1));
    iter_1.m_currEntry._7_1_ = 0;
    UnorderedArrayList<int,_32UL>::Iterator::MoveNext((Iterator *)local_c0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLogTag(writer,ctxTag,this->m_activeScriptContext,CommaAndBigSpaceSeparator);
  EmitListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
            (SnapRootPinEntryEmit,&this->m_rootList,writer);
  EmitListHelper<void(*)(TTD::NSSnapType::SnapHandler_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapHandler,2048ul>
            (NSSnapType::EmitSnapHandler,&this->m_handlerList,writer);
  EmitListHelper<void(*)(TTD::NSSnapType::SnapType_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapType,2048ul>
            (NSSnapType::EmitSnapType,&this->m_typeList,writer);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                    (&this->m_functionBodyList);
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  iter_2.m_currEntry._7_1_ = CommaSeparator;
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::GetIterator
            ((Iterator *)local_f0,&this->m_functionBodyList);
  while( true ) {
    bVar1 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_f0);
    if (!bVar1) break;
    fbInfo = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
             Current((Iterator *)local_f0);
    NSSnapValues::EmitFunctionBodyInfo
              (fbInfo,writer,iter_2.m_currEntry._7_1_ & CommaSeparator ^ CommaAndBigSpaceSeparator);
    iter_2.m_currEntry._7_1_ = NoSeparator;
    UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_f0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  EmitListHelper<void(*)(TTD::NSSnapValues::SnapPrimitiveValue_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapPrimitiveValue,4096ul>
            (NSSnapValues::EmitSnapPrimitiveValue,&this->m_primitiveObjectList,writer);
  uVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                    (&this->m_compoundObjectList);
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  iter_3.m_currEntry._7_1_ = CommaSeparator;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)&almostEndWrite,&this->m_compoundObjectList);
  while( true ) {
    bVar1 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                      ((Iterator *)&almostEndWrite);
    if (!bVar1) break;
    snpObject = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                          ((Iterator *)&almostEndWrite);
    NSSnapObjects::EmitObject
              (snpObject,writer,
               iter_3.m_currEntry._7_1_ & CommaSeparator ^ CommaAndBigSpaceSeparator,
               this->m_snapObjectVTableArray,(ThreadContext *)timer.m_timer.data.previousDifference)
    ;
    iter_3.m_currEntry._7_1_ = NoSeparator;
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)&almostEndWrite);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  EmitListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
            (NSSnapValues::EmitScriptFunctionScopeInfo,&this->m_scopeEntries,writer);
  EmitListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SlotArrayInfo,2048ul>
            (NSSnapValues::EmitSlotArrayInfo,&this->m_slotArrayEntries,writer);
  dVar4 = TTDTimer::Now((TTDTimer *)&startWrite);
  FileWriter::WriteDouble(writer,timeWrite,(dVar4 - local_40) / 1000.0,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[7])(writer,2);
  TTDTimer::~TTDTimer((TTDTimer *)&startWrite);
  return;
}

Assistant:

void SnapShot::EmitSnapshotToFile(FileWriter* writer, ThreadContext* threadContext) const
    {
        TTDTimer timer;
        double startWrite = timer.Now();

        writer->WriteRecordStart();
        writer->AdjustIndent(1);

        uint64 usedSpace = 0;
        uint64 reservedSpace = 0;
        this->ComputeSnapshotMemory(&usedSpace, &reservedSpace);

        writer->WriteDouble(NSTokens::Key::timeTotal, this->GCTime + this->MarkTime + this->ExtractTime);
        writer->WriteUInt64(NSTokens::Key::usedMemory, usedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteUInt64(NSTokens::Key::reservedMemory, reservedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeGC, this->GCTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeMark, this->MarkTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeExtract, this->ExtractTime, NSTokens::Separator::CommaSeparator);

        writer->WriteLengthValue(this->m_ctxList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstCtx = true;
        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitSnapContext(iter.Current(), writer, firstCtx ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstCtx = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        writer->WriteLengthValue(this->m_tcSymbolRegistrationMapContents.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
        bool firstTCSymbol = true;
        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            writer->WriteNakedUInt32((uint32)*iter.Current(), firstTCSymbol ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

            firstTCSymbol = false;
        }
        writer->WriteSequenceEnd();

        writer->WriteLogTag(NSTokens::Key::ctxTag, this->m_activeScriptContext, NSTokens::Separator::CommaAndBigSpaceSeparator);
        SnapShot::EmitListHelper(&SnapShot::SnapRootPinEntryEmit, this->m_rootList, writer);

        ////
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapHandler, this->m_handlerList, writer);
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapType, this->m_typeList, writer);

        ////
        writer->WriteLengthValue(this->m_functionBodyList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstBody = true;
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitFunctionBodyInfo(iter.Current(), writer, firstBody ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstBody = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        SnapShot::EmitListHelper(&NSSnapValues::EmitSnapPrimitiveValue, this->m_primitiveObjectList, writer);

        writer->WriteLengthValue(this->m_compoundObjectList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstObj = true;
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapObjects::EmitObject(iter.Current(), writer, firstObj ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator, this->m_snapObjectVTableArray, threadContext);

            firstObj = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        ////
        SnapShot::EmitListHelper(&NSSnapValues::EmitScriptFunctionScopeInfo, this->m_scopeEntries, writer);
        SnapShot::EmitListHelper(&NSSnapValues::EmitSlotArrayInfo, this->m_slotArrayEntries, writer);

        ////
        double almostEndWrite = timer.Now();
        writer->WriteDouble(NSTokens::Key::timeWrite, (almostEndWrite - startWrite) / 1000.0, NSTokens::Separator::CommaAndBigSpaceSeparator);

        writer->AdjustIndent(-1);
        writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
    }